

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetScrollHereX(float center_x_ratio)

{
  ImGuiWindow_conflict *window;
  uint uVar1;
  float fVar2;
  float fVar3;
  
  window = GImGui->CurrentWindow;
  fVar2 = (window->WindowPadding).x;
  fVar3 = (GImGui->Style).ItemSpacing.x;
  uVar1 = -(uint)(fVar3 <= fVar2);
  fVar2 = (float)(~uVar1 & (uint)fVar3 | (uint)fVar2 & uVar1);
  fVar3 = (GImGui->LastItemData).Rect.Min.x - fVar2;
  SetScrollFromPosX(window,((((GImGui->LastItemData).Rect.Max.x + fVar2) - fVar3) * center_x_ratio +
                           fVar3) - (window->Pos).x,center_x_ratio);
  fVar2 = (window->WindowPadding).x - fVar2;
  (window->ScrollTargetEdgeSnapDist).x = (float)(~-(uint)(fVar2 <= 0.0) & (uint)fVar2);
  return;
}

Assistant:

void ImGui::SetScrollHereX(float center_x_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_x = ImMax(window->WindowPadding.x, g.Style.ItemSpacing.x);
    float target_pos_x = ImLerp(g.LastItemData.Rect.Min.x - spacing_x, g.LastItemData.Rect.Max.x + spacing_x, center_x_ratio);
    SetScrollFromPosX(window, target_pos_x - window->Pos.x, center_x_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.x = ImMax(0.0f, window->WindowPadding.x - spacing_x);
}